

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_arange(ggml_context *ctx,float start,float stop,float step)

{
  ggml_tensor *pgVar1;
  float fVar2;
  
  if (start < stop) {
    fVar2 = ceilf((stop - start) / step);
    pgVar1 = ggml_new_tensor_1d(ctx,GGML_TYPE_F32,(long)fVar2);
    pgVar1->op_params[0] = (int32_t)start;
    pgVar1->op_params[1] = (int32_t)stop;
    pgVar1->op_params[2] = (int32_t)step;
    pgVar1->op = GGML_OP_ARANGE;
    return pgVar1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
             ,0x10e1,"GGML_ASSERT(%s) failed","stop > start");
}

Assistant:

struct ggml_tensor * ggml_arange(
        struct ggml_context * ctx,
        float                 start,
        float                 stop,
        float                 step) {
    GGML_ASSERT(stop > start);

    const int64_t steps = (int64_t) ceilf((stop - start) / step);

    struct ggml_tensor * result = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, steps);

    ggml_set_op_params_f32(result, 0, start);
    ggml_set_op_params_f32(result, 1, stop);
    ggml_set_op_params_f32(result, 2, step);

    result->op = GGML_OP_ARANGE;

    return result;
}